

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

void __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::load
          (segment_impl<ELFIO::Elf64_Phdr> *this,istream *stream,streampos header_offset)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ulong uVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  segment_impl<ELFIO::Elf64_Phdr> *in_RDI;
  bad_alloc *anon_var_0;
  Elf_Xword size;
  streamoff in_stack_ffffffffffffff68;
  fpos<__mbstate_t> *in_stack_ffffffffffffff70;
  undefined8 local_50;
  undefined8 local_48;
  fpos local_30 [16];
  char *local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined4 extraout_var_00;
  
  local_20 = in_RSI;
  local_10 = in_RDX;
  local_8 = in_RCX;
  std::istream::seekg((long)in_RSI,_S_beg);
  local_30 = (fpos  [16])std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long(local_30);
  set_stream_size(in_RDI,sVar2);
  std::istream::seekg(local_20,local_10,local_8);
  std::istream::read(local_20,(long)&in_RDI->ph);
  in_RDI->is_offset_set = true;
  iVar1 = (*(in_RDI->super_segment)._vptr_segment[3])();
  if (iVar1 != 0) {
    iVar1 = (*(in_RDI->super_segment)._vptr_segment[0xd])();
    pcVar4 = local_20;
    if (CONCAT44(extraout_var,iVar1) != 0) {
      endianess_convertor::operator()(in_RDI->convertor,(in_RDI->ph).p_offset);
      std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::istream::seekg(pcVar4,local_50,local_48);
      iVar1 = (*(in_RDI->super_segment)._vptr_segment[0xd])();
      uVar3 = CONCAT44(extraout_var_00,iVar1);
      sVar2 = get_stream_size(in_RDI);
      if (sVar2 < uVar3) {
        in_RDI->data = (char *)0x0;
      }
      else {
        pcVar4 = (char *)operator_new__(uVar3 + 1);
        in_RDI->data = pcVar4;
        if (in_RDI->data != (char *)0x0) {
          std::istream::read(local_20,(long)in_RDI->data);
          in_RDI->data[uVar3] = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void
    load( std::istream&  stream,
          std::streampos header_offset )
    {

	stream.seekg ( 0, stream.end );
	set_stream_size ( stream.tellg() );

        stream.seekg( header_offset );
        stream.read( reinterpret_cast<char*>( &ph ), sizeof( ph ) );
        is_offset_set = true;

        if ( PT_NULL != get_type() && 0 != get_file_size() ) {
            stream.seekg( (*convertor)( ph.p_offset ) );
            Elf_Xword size = get_file_size();
	    if ( size > get_stream_size() ) {
		data = 0;
	    } else {
		try {
		    data = new char[size + 1];
		} catch (const std::bad_alloc&) {
		    data = 0;
		}
		if ( 0 != data ) {
		    stream.read( data, size );
		    data[size] = 0;
		}
	    }
        }
    }